

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  curl_slist *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  Curl_addrinfo *pCVar7;
  void *pvVar8;
  Curl_dns_entry *pCVar9;
  char *__s;
  Curl_addrinfo *pCVar10;
  Curl_addrinfo *pCVar11;
  char *pcVar12;
  int port;
  char address [64];
  char hostname [256];
  uint local_19c;
  Curl_addrinfo *local_198;
  char *local_190;
  Curl_easy *local_188;
  char *local_180;
  char local_178 [64];
  char local_138 [264];
  
  local_19c = 0;
  pcVar1 = (data->change).resolve;
  do {
    if (pcVar1 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar3 = pcVar1->data;
    if (pcVar3 != (char *)0x0) {
      if (*pcVar3 == '-') {
        iVar2 = __isoc99_sscanf(pcVar3 + 1,"%255[^:]:%d",local_138,&local_19c);
        if (iVar2 == 2) {
          pcVar3 = create_hostcache_id(local_138,local_19c);
          if (pcVar3 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          sVar4 = strlen(pcVar3);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          (*Curl_cfree)(pcVar3);
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",pcVar1->data);
        }
      }
      else {
        pcVar5 = strchr(pcVar3,0x3a);
        if ((pcVar5 == (char *)0x0) || (0xff < (long)pcVar5 - (long)pcVar3)) {
LAB_004540f7:
          pCVar10 = (Curl_addrinfo *)0x0;
          pcVar3 = local_190;
        }
        else {
          memcpy(local_138,pcVar3,(long)pcVar5 - (long)pcVar3);
          pcVar5[(long)(local_138 + -(long)pcVar1->data)] = '\0';
          uVar6 = strtoul(pcVar5 + 1,&local_190,10);
          if (0xffff < uVar6) goto LAB_004540f7;
          if (((local_190 != pcVar5 + 1) && (*local_190 == ':')) &&
             (local_19c = (uint)uVar6, *local_190 != '\0')) {
            local_180 = local_190 + 1;
            pCVar10 = (Curl_addrinfo *)0x0;
            pcVar5 = local_190;
            pCVar11 = (Curl_addrinfo *)0x0;
            local_188 = data;
            do {
              __s = pcVar5 + 1;
              local_198 = pCVar10;
              pcVar3 = strchr(__s,0x2c);
              if (pcVar3 == (char *)0x0) {
                sVar4 = strlen(__s);
                pcVar3 = __s + sVar4;
              }
              pcVar12 = pcVar3;
              data = local_188;
              pCVar10 = local_198;
              if (*__s == '[') {
                if ((pcVar3 == __s) || (pcVar3[-1] != ']')) goto LAB_004540fa;
                __s = pcVar5 + 2;
                pcVar12 = pcVar3 + -1;
              }
              uVar6 = (long)pcVar12 - (long)__s;
              pCVar7 = pCVar11;
              if (uVar6 != 0) {
                if (0x3f < uVar6) goto LAB_004540fa;
                memcpy(local_178,__s,uVar6);
                local_178[uVar6] = '\0';
                pCVar7 = Curl_str2addr(local_178,local_19c);
                data = local_188;
                if (pCVar7 == (Curl_addrinfo *)0x0) {
                  local_190 = pcVar3;
                  Curl_infof(local_188,"Resolve address \'%s\' found illegal!\n",local_178);
                  pCVar10 = local_198;
                  pcVar3 = local_190;
                  goto LAB_004540fa;
                }
                pCVar10 = pCVar7;
                if (pCVar11 != (Curl_addrinfo *)0x0) {
                  pCVar11->ai_next = pCVar7;
                  pCVar10 = local_198;
                }
              }
              data = local_188;
              pcVar5 = pcVar3;
              pCVar11 = pCVar7;
            } while (*pcVar3 != '\0');
            local_190 = pcVar3;
            if (pCVar10 != (Curl_addrinfo *)0x0) {
              pcVar3 = create_hostcache_id(local_138,local_19c);
              if (pcVar3 == (char *)0x0) {
LAB_004543c6:
                Curl_freeaddrinfo(pCVar10);
                return CURLE_OUT_OF_MEMORY;
              }
              local_198 = pCVar10;
              sVar4 = strlen(pcVar3);
              if (data->share != (Curl_share *)0x0) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              pvVar8 = Curl_hash_pick((data->dns).hostcache,pcVar3,sVar4 + 1);
              if (pvVar8 != (void *)0x0) {
                Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded!\n",local_138,
                           (ulong)local_19c);
                Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
              }
              (*Curl_cfree)(pcVar3);
              pCVar10 = local_198;
              pCVar9 = Curl_cache_addr(data,local_198,local_138,local_19c);
              if (pCVar9 != (Curl_dns_entry *)0x0) {
                pCVar9->timestamp = 0;
                pCVar9->inuse = pCVar9->inuse + -1;
              }
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
              if (pCVar9 == (Curl_dns_entry *)0x0) goto LAB_004543c6;
              Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_138,(ulong)local_19c,local_180);
              goto LAB_0045412c;
            }
          }
          pCVar10 = (Curl_addrinfo *)0x0;
          pcVar3 = local_190;
        }
LAB_004540fa:
        local_190 = pcVar3;
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar1->data);
        Curl_freeaddrinfo(pCVar10);
      }
    }
LAB_0045412c:
    pcVar1 = pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *head = NULL, *tail = NULL;
      char *entry_id;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded!\n",
                hostname, port);
        /* delete old entry entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as added by CURLOPT_RESOLVE. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }
      /* free the allocated entry_id again */
      free(entry_id);

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
            dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}